

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString __thiscall
SimpleString::subStringFromTill(SimpleString *this,char startChar,char lastExcludedChar)

{
  size_t sVar1;
  size_t sVar2;
  char in_CL;
  size_t extraout_RDX;
  undefined7 in_register_00000031;
  SimpleString *this_00;
  SimpleString SVar3;
  
  this_00 = (SimpleString *)CONCAT71(in_register_00000031,startChar);
  sVar1 = find(this_00,lastExcludedChar);
  if (sVar1 == 0xffffffffffffffff) {
    SimpleString(this,"");
    sVar1 = extraout_RDX;
  }
  else {
    sVar2 = findFrom(this_00,sVar1,in_CL);
    if (sVar2 == 0xffffffffffffffff) {
      SVar3 = subString(this,(size_t)this_00);
      sVar1 = SVar3.bufferSize_;
    }
    else {
      SVar3 = subString(this,(size_t)this_00,sVar1);
      sVar1 = SVar3.bufferSize_;
    }
  }
  SVar3.bufferSize_ = sVar1;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString SimpleString::subStringFromTill(char startChar, char lastExcludedChar) const
{
    size_t beginPos = find(startChar);
    if (beginPos == npos) return "";

    size_t endPos = findFrom(beginPos, lastExcludedChar);
    if (endPos == npos) return subString(beginPos);

    return subString(beginPos, endPos - beginPos);
}